

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O2

int __thiscall ncnn::PReLU::forward_inplace(PReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int j;
  ulong uVar12;
  ulong uVar13;
  
  iVar3 = bottom_top_blob->dims;
  if (iVar3 == 3) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar8 = bottom_top_blob->data;
    sVar5 = bottom_top_blob->cstep;
    uVar9 = 0;
    uVar11 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar11 = uVar9;
    }
    iVar3 = this->num_slope;
    uVar10 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar10 = uVar9;
    }
    sVar6 = bottom_top_blob->elemsize;
    for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
      uVar13 = uVar12 & 0xffffffff;
      if (iVar3 < 2) {
        uVar13 = uVar9;
      }
      fVar1 = *(float *)((long)(this->slope_data).data + uVar13 * 4);
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        fVar2 = *(float *)((long)pvVar8 + uVar13 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar8 + uVar13 * 4) = fVar2 * fVar1;
        }
      }
      pvVar8 = (void *)((long)pvVar8 + sVar5 * sVar6);
    }
  }
  else if (iVar3 == 2) {
    uVar7 = bottom_top_blob->w;
    pvVar8 = bottom_top_blob->data;
    uVar11 = 0;
    if (0 < (int)uVar7) {
      uVar11 = (ulong)uVar7;
    }
    iVar3 = this->num_slope;
    uVar9 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar9 = 0;
    }
    sVar5 = bottom_top_blob->elemsize;
    for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      uVar12 = uVar10 & 0xffffffff;
      if (iVar3 < 2) {
        uVar12 = 0;
      }
      fVar1 = *(float *)((long)(this->slope_data).data + uVar12 * 4);
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        fVar2 = *(float *)((long)pvVar8 + uVar12 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar8 + uVar12 * 4) = fVar2 * fVar1;
        }
      }
      pvVar8 = (void *)((long)pvVar8 + (long)(int)uVar7 * sVar5);
    }
  }
  else if (iVar3 == 1) {
    uVar7 = bottom_top_blob->w;
    pvVar8 = bottom_top_blob->data;
    pfVar4 = (float *)(this->slope_data).data;
    if (this->num_slope < 2) {
      fVar1 = *pfVar4;
      uVar9 = 0;
      uVar11 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar11 = uVar9;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        fVar2 = *(float *)((long)pvVar8 + uVar9 * 4);
        if (fVar2 < 0.0) {
          *(float *)((long)pvVar8 + uVar9 * 4) = fVar2 * fVar1;
        }
      }
    }
    else {
      uVar9 = 0;
      uVar11 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar11 = uVar9;
      }
      for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        fVar1 = *(float *)((long)pvVar8 + uVar9 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar8 + uVar9 * 4) = fVar1 * pfVar4[uVar9];
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (num_slope > 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float slope = slope_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];

            for (int j = 0; j < w; j++)
            {
                if (ptr[j] < 0)
                    ptr[j] *= slope;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}